

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::Group::~Group(Group *this)

{
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__Group_00200190;
  std::_Function_base::~_Function_base(&(this->validator).super__Function_base);
  std::_Vector_base<args::Base_*,_std::allocator<args::Base_*>_>::~_Vector_base
            (&(this->children).super__Vector_base<args::Base_*,_std::allocator<args::Base_*>_>);
  Base::~Base(&this->super_Base);
  return;
}

Assistant:

virtual ~Group() {}